

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O3

string * hashStr(string *__return_storage_ptr__,uint32_t param_1,size_t n,string *default_value,
                string *map_name,string *key_type,bool nonKeyLookups)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  size_t sVar10;
  size_type *psVar11;
  char cVar12;
  undefined8 uVar13;
  ulong uVar14;
  string __str;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  hashStr_abi_cxx11_(&local_50,param_1);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(map_name->_M_dataplus)._M_p);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d0 = &local_c0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_c0 = *plVar8;
    lStack_b8 = plVar6[3];
  }
  else {
    local_c0 = *plVar8;
    local_d0 = (long *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(key_type->_M_dataplus)._M_p);
  local_b0 = &local_a0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  paVar2 = &local_118.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_118.field_2._M_allocated_capacity = *puVar9;
    local_118.field_2._8_8_ = plVar6[3];
    local_118._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *puVar9;
    local_118._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_118._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar12 = '\x01';
  if (9 < n) {
    sVar10 = n;
    cVar5 = '\x04';
    do {
      cVar12 = cVar5;
      if (sVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001072e0;
      }
      if (sVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001072e0;
      }
      if (sVar10 < 10000) goto LAB_001072e0;
      bVar3 = 99999 < sVar10;
      sVar10 = sVar10 / 10000;
      cVar5 = cVar12 + '\x04';
    } while (bVar3);
    cVar12 = cVar12 + '\x01';
  }
LAB_001072e0:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,local_e8,n);
  uVar1 = CONCAT44(uStack_e4,local_e8) + local_118._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    uVar13 = local_118.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar1) {
    uVar14 = 0xf;
    if (local_f0 != local_e0) {
      uVar14 = local_e0[0];
    }
    if (uVar1 <= uVar14) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f0,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
      goto LAB_00107362;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f0);
LAB_00107362:
  local_138 = &local_128;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_128 = *plVar6;
    uStack_120 = puVar7[3];
  }
  else {
    local_128 = *plVar6;
    local_138 = (long *)*puVar7;
  }
  local_130 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f8;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar4 = plVar6[3];
    local_f8->_M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (nonKeyLookups) {
    std::operator+(&local_118,
                   "    return keys[h] == key ? std::string_view(&flat_vals[val_start[h]], val_size[h]) : \""
                   ,default_value);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_128 = *plVar6;
      uStack_120 = puVar7[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar6;
      local_138 = (long *)*puVar7;
    }
    local_130 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(uint32_t, size_t n, const std::string& default_value, std::string map_name, std::string key_type, bool nonKeyLookups){
    std::string hash = hashStr(uint32_t()) +
        "};\n"
        "\n"
        "constexpr std::string_view " + map_name + "::lookup(const " + key_type + "& key) noexcept{\n"
        "    const size_t h = hash(key) & " + std::to_string(n) + ";\n";
    if(nonKeyLookups) hash +=
        "    return keys[h] == key ? std::string_view(&flat_vals[val_start[h]], val_size[h]) : \"" + default_value + "\";\n";
    else hash +=
        "    #ifndef NDEBUG\n"
        "    assert(keys[h] == key);\n"
        "    #endif\n\n"
        "    return std::string_view(&flat_vals[val_start[h]], val_size[h]);\n";

    hash += "}\n\n";

    return hash;
}